

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O0

void variance16_avx2(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int h,__m256i *vsse,
                    __m256i *vsum)

{
  undefined8 unaff_RBP;
  int in_R8D;
  uint8_t *unaff_retaddr;
  undefined8 *in_stack_00000008;
  int local_8c;
  __m256i *in_stack_ffffffffffffffd8;
  __m256i *in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffec;
  uint8_t *in_stack_fffffffffffffff0;
  
  *in_stack_00000008 = 0;
  in_stack_00000008[1] = 0;
  in_stack_00000008[2] = 0;
  in_stack_00000008[3] = 0;
  for (local_8c = 0; local_8c < in_R8D; local_8c = local_8c + 2) {
    variance16_kernel_avx2
              (unaff_retaddr,(int)((ulong)unaff_RBP >> 0x20),in_stack_fffffffffffffff0,
               in_stack_ffffffffffffffec,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static inline void variance16_avx2(const uint8_t *src, const int src_stride,
                                   const uint8_t *ref, const int ref_stride,
                                   const int h, __m256i *const vsse,
                                   __m256i *const vsum) {
  *vsum = _mm256_setzero_si256();

  for (int i = 0; i < h; i += 2) {
    variance16_kernel_avx2(src, src_stride, ref, ref_stride, vsse, vsum);
    src += 2 * src_stride;
    ref += 2 * ref_stride;
  }
}